

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonMeshBuilder.cpp
# Opt level: O2

void __thiscall Assimp::SkeletonMeshBuilder::CreateGeometry(SkeletonMeshBuilder *this,aiNode *pNode)

{
  vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
  *pvVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer paVar4;
  pointer paVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  aiBone *paVar31;
  aiMatrix4x4t<float> *paVar32;
  aiVertexWeight *paVar33;
  aiVector3t<float> *paVar34;
  uint a_1;
  ulong uVar35;
  uint a;
  uint a_2;
  aiNode *paVar36;
  ulong uVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  aiVector3t<float> aVar42;
  aiVector3t<float> local_158;
  undefined1 local_148 [16];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  aiBone *bone;
  float local_120;
  aiVector3D front;
  aiVector3D childpos;
  float fStack_fc;
  aiVector3t<float> local_b8 [4];
  aiVector3D up;
  float fStack_7c;
  
  uVar29 = ((long)(this->mVertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
           (long)(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0xc;
  uVar28 = pNode->mNumChildren;
  fVar6 = (float)uVar29;
  if ((uVar28 == 0) || (this->mKnobsOnly != false)) {
    fVar38 = (pNode->mTransformation).a4;
    fVar41 = (pNode->mTransformation).b4;
    fVar39 = (pNode->mTransformation).c4;
    local_138 = SQRT(fVar39 * fVar39 + fVar38 * fVar38 + fVar41 * fVar41) * 0.18;
    local_148 = ZEXT416((uint)local_138);
    local_138 = -local_138;
    fStack_134 = -0.0;
    fStack_130 = -0.0;
    fStack_12c = -0.0;
    childpos.y = 0.0;
    childpos.z = 0.0;
    childpos.x = local_138;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = (float)local_148._0_4_;
    childpos.z = 0.0;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = 0.0;
    childpos.z = local_138;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = (float)local_148._0_4_;
    childpos.z = 0.0;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = (float)local_148._0_4_;
    childpos.y = 0.0;
    childpos.z = 0.0;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = 0.0;
    childpos.z = local_138;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = (float)local_148._0_4_;
    childpos.y = 0.0;
    childpos.z = 0.0;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = local_138;
    childpos.z = 0.0;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = 0.0;
    childpos.z = local_138;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = local_138;
    childpos.z = 0.0;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = local_138;
    childpos.y = 0.0;
    childpos.z = 0.0;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = 0.0;
    childpos.z = local_138;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = local_138;
    childpos.y = 0.0;
    childpos.z = 0.0;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = 0.0;
    childpos.z = (float)local_148._0_4_;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = (float)local_148._0_4_;
    childpos.z = 0.0;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = (float)local_148._0_4_;
    childpos.z = 0.0;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = 0.0;
    childpos.z = (float)local_148._0_4_;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = (float)local_148._0_4_;
    childpos.y = 0.0;
    childpos.z = 0.0;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = (float)local_148._0_4_;
    childpos.y = 0.0;
    childpos.z = 0.0;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = 0.0;
    childpos.z = (float)local_148._0_4_;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = local_138;
    childpos.z = 0.0;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = local_138;
    childpos.z = 0.0;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = 0.0;
    childpos.y = 0.0;
    childpos.z = (float)local_148._0_4_;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    childpos.x = local_138;
    childpos.y = 0.0;
    childpos.z = 0.0;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&childpos);
    pvVar1 = &this->mFaces;
    childpos.y = (float)((int)fVar6 + 1);
    childpos.z = (float)((int)fVar6 + 2);
    childpos.x = fVar6;
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    emplace_back<Assimp::SkeletonMeshBuilder::Face>(pvVar1,(Face *)&childpos);
    childpos.x = (float)((int)fVar6 + 3);
    childpos.y = (float)((int)fVar6 + 4);
    childpos.z = (float)((int)fVar6 + 5);
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    emplace_back<Assimp::SkeletonMeshBuilder::Face>(pvVar1,(Face *)&childpos);
    childpos.x = (float)((int)fVar6 + 6);
    childpos.y = (float)((int)fVar6 + 7);
    childpos.z = (float)((int)fVar6 + 8);
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    emplace_back<Assimp::SkeletonMeshBuilder::Face>(pvVar1,(Face *)&childpos);
    childpos.x = (float)((int)fVar6 + 9);
    childpos.y = (float)((int)fVar6 + 10);
    childpos.z = (float)((int)fVar6 + 0xb);
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    emplace_back<Assimp::SkeletonMeshBuilder::Face>(pvVar1,(Face *)&childpos);
    childpos.x = (float)((int)fVar6 + 0xc);
    childpos.y = (float)((int)fVar6 + 0xd);
    childpos.z = (float)((int)fVar6 + 0xe);
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    emplace_back<Assimp::SkeletonMeshBuilder::Face>(pvVar1,(Face *)&childpos);
    childpos.x = (float)((int)fVar6 + 0xf);
    childpos.y = (float)((int)fVar6 + 0x10);
    childpos.z = (float)((int)fVar6 + 0x11);
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    emplace_back<Assimp::SkeletonMeshBuilder::Face>(pvVar1,(Face *)&childpos);
    childpos.x = (float)((int)fVar6 + 0x12);
    childpos.y = (float)((int)fVar6 + 0x13);
    childpos.z = (float)((int)fVar6 + 0x14);
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    emplace_back<Assimp::SkeletonMeshBuilder::Face>(pvVar1,(Face *)&childpos);
    childpos.x = (float)((int)fVar6 + 0x15);
    childpos.y = (float)((int)fVar6 + 0x16);
    childpos.z = (float)((int)fVar6 + 0x17);
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    emplace_back<Assimp::SkeletonMeshBuilder::Face>(pvVar1,(Face *)&childpos);
  }
  else {
    pvVar1 = &this->mFaces;
    for (uVar35 = 0; uVar35 < uVar28; uVar35 = uVar35 + 1) {
      paVar36 = pNode->mChildren[uVar35];
      childpos.x = (paVar36->mTransformation).a4;
      childpos.y = (paVar36->mTransformation).b4;
      childpos.z = (paVar36->mTransformation).c4;
      fVar38 = SQRT(childpos.z * childpos.z + childpos.x * childpos.x + childpos.y * childpos.y);
      if (0.0001 <= fVar38) {
        local_148 = ZEXT416((uint)fVar38);
        bone = (aiBone *)CONCAT44(childpos.y,childpos.x);
        local_120 = childpos.z;
        paVar34 = aiVector3t<float>::Normalize((aiVector3t<float> *)&bone);
        up.z = paVar34->z;
        up.x = paVar34->x;
        up.y = paVar34->y;
        bone = (aiBone *)0x3f800000;
        local_120 = 0.0;
        if (0.99 < ABS(paVar34->z * 0.0 + up.y * 0.0 + up.x)) {
          bone = (aiBone *)0x3f80000000000000;
        }
        aVar42 = operator^(&up,(aiVector3t<float> *)&bone);
        local_158.z = aVar42.z;
        local_158._0_8_ = aVar42._0_8_;
        paVar34 = aiVector3t<float>::Normalize(&local_158);
        front.x = paVar34->x;
        front.y = paVar34->y;
        front.z = paVar34->z;
        aVar42 = operator^(&front,&up);
        local_158.z = aVar42.z;
        local_158._0_8_ = aVar42._0_8_;
        paVar34 = aiVector3t<float>::Normalize(&local_158);
        fVar38 = paVar34->z;
        local_138 = (float)local_148._0_4_;
        fStack_134 = (float)local_148._0_4_;
        fStack_130 = (float)local_148._0_4_;
        fStack_12c = (float)local_148._0_4_;
        fVar41 = -fVar38 * (float)local_148._0_4_;
        uVar2 = paVar34->x;
        uVar3 = paVar34->y;
        paVar4 = (this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        paVar5 = (this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_158.z = -front.z * (float)local_148._0_4_ * 0.1;
        local_158.y = -front.y * (float)local_148._0_4_ * 0.1;
        local_158.x = -front.x * (float)local_148._0_4_ * 0.1;
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        emplace_back<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&local_158);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,&childpos);
        fVar39 = -(float)uVar2 * local_138 * 0.1;
        fVar40 = -(float)uVar3 * fStack_134 * 0.1;
        fVar41 = fVar41 * 0.1;
        local_158.y = fVar40;
        local_158.x = fVar39;
        local_158.z = fVar41;
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        emplace_back<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&local_158);
        local_158.z = fVar41;
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        emplace_back<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&local_158);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,&childpos);
        local_158.z = front.z * (float)local_148._0_4_ * 0.1;
        local_158.y = front.y * fStack_134 * 0.1;
        local_158.x = front.x * local_138 * 0.1;
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        emplace_back<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&local_158);
        local_158.z = front.z * (float)local_148._0_4_ * 0.1;
        local_158.y = front.y * fStack_134 * 0.1;
        local_158.x = front.x * local_138 * 0.1;
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        emplace_back<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&local_158);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,&childpos);
        fVar41 = (float)uVar2 * local_138 * 0.1;
        fVar39 = (float)uVar3 * fStack_134 * 0.1;
        fVar38 = fVar38 * (float)local_148._0_4_ * 0.1;
        local_158.y = fVar39;
        local_158.x = fVar41;
        local_158.z = fVar38;
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        emplace_back<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&local_158);
        local_158.z = fVar38;
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        emplace_back<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&local_158);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,&childpos);
        local_158.z = -front.z * (float)local_148._0_4_ * 0.1;
        local_158.y = -front.y * fStack_134 * 0.1;
        local_158.x = -front.x * local_138 * 0.1;
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        emplace_back<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,&local_158);
        fVar38 = (float)(((long)paVar4 - (long)paVar5) / 0xc);
        local_158.z = (float)((int)fVar38 + 2);
        local_158.y = (float)((int)fVar38 + 1);
        local_158.x = fVar38;
        std::
        vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ::emplace_back<Assimp::SkeletonMeshBuilder::Face>(pvVar1,(Face *)&local_158);
        local_158.z = (float)((int)fVar38 + 5);
        local_158.y = (float)((int)fVar38 + 4);
        local_158.x = (float)((int)fVar38 + 3);
        std::
        vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ::emplace_back<Assimp::SkeletonMeshBuilder::Face>(pvVar1,(Face *)&local_158);
        local_158.z = (float)((int)fVar38 + 8);
        local_158.y = (float)((int)fVar38 + 7);
        local_158.x = (float)((int)fVar38 + 6);
        std::
        vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ::emplace_back<Assimp::SkeletonMeshBuilder::Face>(pvVar1,(Face *)&local_158);
        local_158.z = (float)((int)fVar38 + 0xb);
        local_158.y = (float)((int)fVar38 + 10);
        local_158.x = (float)((int)fVar38 + 9);
        std::
        vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ::emplace_back<Assimp::SkeletonMeshBuilder::Face>(pvVar1,(Face *)&local_158);
        uVar28 = pNode->mNumChildren;
      }
    }
  }
  lVar30 = ((long)(this->mVertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
           (long)(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0xc - uVar29;
  if ((int)lVar30 != 0) {
    local_148._0_8_ = lVar30;
    paVar31 = (aiBone *)operator_new(0x460);
    aiBone::aiBone(paVar31);
    bone = paVar31;
    std::vector<aiBone_*,_std::allocator<aiBone_*>_>::push_back(&this->mBones,&bone);
    paVar31 = bone;
    if ((aiNode *)bone != pNode) {
      uVar28 = (pNode->mName).length;
      (bone->mName).length = uVar28;
      memcpy((bone->mName).data,(pNode->mName).data,(ulong)uVar28);
      (paVar31->mName).data[uVar28] = '\0';
    }
    uVar7 = (pNode->mTransformation).a1;
    uVar8 = (pNode->mTransformation).a2;
    uVar9 = (pNode->mTransformation).a3;
    childpos.x = (float)uVar7;
    childpos.y = (float)uVar8;
    childpos.z = (float)uVar9;
    paVar32 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&childpos);
    fVar38 = paVar32->a2;
    fVar41 = paVar32->a3;
    fVar39 = paVar32->a4;
    fVar40 = paVar32->b1;
    fVar17 = paVar32->b2;
    fVar18 = paVar32->b3;
    fVar19 = paVar32->b4;
    fVar20 = paVar32->c1;
    fVar21 = paVar32->c2;
    fVar22 = paVar32->c3;
    fVar23 = paVar32->c4;
    fVar24 = paVar32->d1;
    fVar25 = paVar32->d2;
    fVar26 = paVar32->d3;
    fVar27 = paVar32->d4;
    (bone->mOffsetMatrix).a1 = paVar32->a1;
    (bone->mOffsetMatrix).a2 = fVar38;
    (bone->mOffsetMatrix).a3 = fVar41;
    (bone->mOffsetMatrix).a4 = fVar39;
    (bone->mOffsetMatrix).b1 = fVar40;
    (bone->mOffsetMatrix).b2 = fVar17;
    (bone->mOffsetMatrix).b3 = fVar18;
    (bone->mOffsetMatrix).b4 = fVar19;
    (bone->mOffsetMatrix).c1 = fVar20;
    (bone->mOffsetMatrix).c2 = fVar21;
    (bone->mOffsetMatrix).c3 = fVar22;
    (bone->mOffsetMatrix).c4 = fVar23;
    (bone->mOffsetMatrix).d1 = fVar24;
    (bone->mOffsetMatrix).d2 = fVar25;
    (bone->mOffsetMatrix).d3 = fVar26;
    (bone->mOffsetMatrix).d4 = fVar27;
    paVar36 = pNode;
    while (paVar31 = bone, paVar36 = paVar36->mParent, paVar36 != (aiNode *)0x0) {
      up.x = (paVar36->mTransformation).a1;
      up.y = (paVar36->mTransformation).a2;
      up.z = (paVar36->mTransformation).a3;
      fStack_7c = (paVar36->mTransformation).a4;
      paVar32 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&up);
      uVar10 = paVar32->a1;
      uVar11 = paVar32->a2;
      uVar12 = paVar32->a3;
      uVar13 = paVar32->a4;
      fVar38 = paVar32->b1;
      fVar41 = paVar32->b2;
      fVar39 = paVar32->b3;
      fVar40 = paVar32->b4;
      fVar17 = paVar32->c1;
      fVar18 = paVar32->c2;
      fVar19 = paVar32->c3;
      fVar20 = paVar32->c4;
      fVar21 = paVar32->d1;
      fVar22 = paVar32->d2;
      fVar23 = paVar32->d3;
      fVar24 = paVar32->d4;
      childpos.x = (float)uVar10;
      childpos.y = (float)uVar11;
      childpos.z = (float)uVar12;
      aiMatrix4x4t<float>::operator*=((aiMatrix4x4t<float> *)&childpos,&bone->mOffsetMatrix);
      (bone->mOffsetMatrix).a1 = childpos.x;
      (bone->mOffsetMatrix).a2 = childpos.y;
      (bone->mOffsetMatrix).a3 = childpos.z;
      (bone->mOffsetMatrix).a4 = (float)uVar13;
      (bone->mOffsetMatrix).b1 = fVar38;
      (bone->mOffsetMatrix).b2 = fVar41;
      (bone->mOffsetMatrix).b3 = fVar39;
      (bone->mOffsetMatrix).b4 = fVar40;
      (bone->mOffsetMatrix).c1 = fVar17;
      (bone->mOffsetMatrix).c2 = fVar18;
      (bone->mOffsetMatrix).c3 = fVar19;
      (bone->mOffsetMatrix).c4 = fVar20;
      (bone->mOffsetMatrix).d1 = fVar21;
      (bone->mOffsetMatrix).d2 = fVar22;
      (bone->mOffsetMatrix).d3 = fVar23;
      (bone->mOffsetMatrix).d4 = fVar24;
    }
    bone->mNumWeights = local_148._0_4_;
    uVar37 = local_148._0_8_ & 0xffffffff;
    uVar35 = uVar37 * 8;
    paVar33 = (aiVertexWeight *)operator_new__(uVar35);
    memset(paVar33,0,uVar35);
    paVar31->mWeights = paVar33;
    for (uVar35 = 0; uVar37 != uVar35; uVar35 = uVar35 + 1) {
      paVar33 = bone->mWeights;
      paVar33[uVar35].mVertexId = (int)fVar6 + (int)uVar35;
      paVar33[uVar35].mWeight = 1.0;
    }
    up.x = (bone->mOffsetMatrix).a1;
    up.y = (bone->mOffsetMatrix).a2;
    up.z = (bone->mOffsetMatrix).a3;
    fStack_7c = (bone->mOffsetMatrix).a4;
    paVar32 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&up);
    uVar14 = paVar32->a1;
    uVar15 = paVar32->a2;
    uVar16 = paVar32->a3;
    childpos.x = (float)uVar14;
    childpos.y = (float)uVar15;
    childpos.z = (float)uVar16;
    while( true ) {
      uVar35 = uVar29 & 0xffffffff;
      paVar4 = (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->mVertices).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)paVar4) / 0xc) <= uVar35)
      break;
      aVar42 = ::operator*((aiMatrix4x4t<float> *)&childpos,paVar4 + uVar35);
      paVar5 = (this->mVertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar4 = paVar5 + uVar35;
      paVar4->x = (float)(int)aVar42._0_8_;
      paVar4->y = (float)(int)((ulong)aVar42._0_8_ >> 0x20);
      paVar5[uVar35].z = aVar42.z;
      uVar29 = (ulong)((int)uVar29 + 1);
    }
  }
  for (uVar29 = 0; uVar29 < pNode->mNumChildren; uVar29 = uVar29 + 1) {
    CreateGeometry(this,pNode->mChildren[uVar29]);
  }
  return;
}

Assistant:

void SkeletonMeshBuilder::CreateGeometry( const aiNode* pNode)
{
    // add a joint entry for the node.
    const unsigned int vertexStartIndex = static_cast<unsigned int>(mVertices.size());

    // now build the geometry.
    if( pNode->mNumChildren > 0 && !mKnobsOnly)
    {
        // If the node has children, we build little pointers to each of them
        for( unsigned int a = 0; a < pNode->mNumChildren; a++)
        {
            // find a suitable coordinate system
            const aiMatrix4x4& childTransform = pNode->mChildren[a]->mTransformation;
            aiVector3D childpos( childTransform.a4, childTransform.b4, childTransform.c4);
            ai_real distanceToChild = childpos.Length();
            if( distanceToChild < 0.0001)
                continue;
            aiVector3D up = aiVector3D( childpos).Normalize();

            aiVector3D orth( 1.0, 0.0, 0.0);
            if( std::fabs( orth * up) > 0.99)
                orth.Set( 0.0, 1.0, 0.0);

            aiVector3D front = (up ^ orth).Normalize();
            aiVector3D side = (front ^ up).Normalize();

            unsigned int localVertexStart = static_cast<unsigned int>(mVertices.size());
            mVertices.push_back( -front * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( -side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( -side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( front * distanceToChild * (ai_real)0.1);
            mVertices.push_back( front * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( -front * distanceToChild * (ai_real)0.1);

            mFaces.push_back( Face( localVertexStart + 0, localVertexStart + 1, localVertexStart + 2));
            mFaces.push_back( Face( localVertexStart + 3, localVertexStart + 4, localVertexStart + 5));
            mFaces.push_back( Face( localVertexStart + 6, localVertexStart + 7, localVertexStart + 8));
            mFaces.push_back( Face( localVertexStart + 9, localVertexStart + 10, localVertexStart + 11));
        }
    }
    else
    {
        // if the node has no children, it's an end node. Put a little knob there instead
        aiVector3D ownpos( pNode->mTransformation.a4, pNode->mTransformation.b4, pNode->mTransformation.c4);
        ai_real sizeEstimate = ownpos.Length() * ai_real( 0.18 );

        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));

        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));

        mFaces.push_back( Face( vertexStartIndex + 0, vertexStartIndex + 1, vertexStartIndex + 2));
        mFaces.push_back( Face( vertexStartIndex + 3, vertexStartIndex + 4, vertexStartIndex + 5));
        mFaces.push_back( Face( vertexStartIndex + 6, vertexStartIndex + 7, vertexStartIndex + 8));
        mFaces.push_back( Face( vertexStartIndex + 9, vertexStartIndex + 10, vertexStartIndex + 11));
        mFaces.push_back( Face( vertexStartIndex + 12, vertexStartIndex + 13, vertexStartIndex + 14));
        mFaces.push_back( Face( vertexStartIndex + 15, vertexStartIndex + 16, vertexStartIndex + 17));
        mFaces.push_back( Face( vertexStartIndex + 18, vertexStartIndex + 19, vertexStartIndex + 20));
        mFaces.push_back( Face( vertexStartIndex + 21, vertexStartIndex + 22, vertexStartIndex + 23));
    }

    unsigned int numVertices = static_cast<unsigned int>(mVertices.size() - vertexStartIndex);
    if( numVertices > 0)
    {
        // create a bone affecting all the newly created vertices
        aiBone* bone = new aiBone;
        mBones.push_back( bone);
        bone->mName = pNode->mName;

        // calculate the bone offset matrix by concatenating the inverse transformations of all parents
        bone->mOffsetMatrix = aiMatrix4x4( pNode->mTransformation).Inverse();
        for( aiNode* parent = pNode->mParent; parent != NULL; parent = parent->mParent)
            bone->mOffsetMatrix = aiMatrix4x4( parent->mTransformation).Inverse() * bone->mOffsetMatrix;

        // add all the vertices to the bone's influences
        bone->mNumWeights = numVertices;
        bone->mWeights = new aiVertexWeight[numVertices];
        for( unsigned int a = 0; a < numVertices; a++)
            bone->mWeights[a] = aiVertexWeight( vertexStartIndex + a, 1.0);

        // HACK: (thom) transform all vertices to the bone's local space. Should be done before adding
        // them to the array, but I'm tired now and I'm annoyed.
        aiMatrix4x4 boneToMeshTransform = aiMatrix4x4( bone->mOffsetMatrix).Inverse();
        for( unsigned int a = vertexStartIndex; a < mVertices.size(); a++)
            mVertices[a] = boneToMeshTransform * mVertices[a];
    }

    // and finally recurse into the children list
    for( unsigned int a = 0; a < pNode->mNumChildren; a++)
        CreateGeometry( pNode->mChildren[a]);
}